

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

FILE * __thiscall Pathie::Path::fopen(Path *this,char *__filename,char *__modes)

{
  FILE *pFVar1;
  ErrnoError *this_00;
  int *piVar2;
  string nstr;
  string local_30;
  
  utf8_to_filename(&local_30,&this->m_path);
  pFVar1 = ::fopen(local_30._M_dataplus._M_p,__filename);
  if (pFVar1 != (FILE *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    return pFVar1;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

FILE* Path::fopen(const char* mode) const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();

  FILE* ptr = ::fopen(nstr.c_str(), mode);
  if (ptr)
    return ptr;
  else
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  std::wstring utf16_path = utf8_to_utf16(m_path);
  std::wstring utf16_mode = utf8_to_utf16(mode);
  FILE* ptr = _wfopen(utf16_path.c_str(), utf16_mode.c_str());

  if (ptr)
    return ptr;
  else
    throw(Pathie::ErrnoError(errno));
#else
#error Unsupported system.
#endif
}